

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::deduplicateBinary(OptimizeInstructions *this,Binary *outer)

{
  BinaryOp BVar1;
  Type type;
  bool bVar2;
  BinaryOp BVar3;
  Expression *pEVar4;
  EffectAnalyzer local_1a8;
  bool local_31;
  
  type.id = (outer->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  if ((type.id & 0xfffffffffffffffe) == 2) {
    pEVar4 = outer->right;
    if ((pEVar4->_id == BinaryId) && (outer->op == pEVar4[1]._id)) {
      EffectAnalyzer::EffectAnalyzer
                (&local_1a8,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,outer->left);
      local_31 = true;
      if ((((local_1a8.trap == false) &&
           (((((local_1a8.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
               (local_1a8.danglingPop == false)) &&
              (local_1a8.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
             ((local_1a8.writesMemory == false && (local_1a8.writesTable == false)))) &&
            (local_1a8.writesStruct == false)))) &&
          (((local_1a8.writesArray == false && (local_1a8.isAtomic == false)) &&
           (local_1a8.calls == false)))) &&
         (((local_1a8.throws_ == false &&
           (local_1a8.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
          (local_1a8.branchesOut == false)))) {
        local_31 = local_1a8.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count != 0;
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.delegateTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.breakTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.globalsWritten._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.mutableGlobalsRead._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_1a8.localsWritten._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_1a8.localsRead._M_t);
      if (local_1a8.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a8.funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_31 == false) {
        bVar2 = ExpressionAnalyzer::equal((Expression *)pEVar4[1].type.id,outer->left);
        if (bVar2) {
          BVar1 = outer->op;
          BVar3 = SubInt64;
          if (type.id == 2) {
            BVar3 = SubInt32;
          }
          if ((BVar1 == BVar3) || (BVar3 = Abstract::getBinary(type,Xor), BVar1 == BVar3))
          goto LAB_007fd34e;
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,And);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,Or);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
        }
        bVar2 = ExpressionAnalyzer::equal(*(Expression **)(pEVar4 + 2),outer->left);
        if ((bVar2) &&
           (bVar2 = EffectAnalyzer::canReorder
                              (&((this->
                                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                 ).super_Pass.runner)->options,
                               (this->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).
                               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .
                               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .currModule,outer->left,(Expression *)pEVar4[1].type.id), bVar2)) {
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,Xor);
          if (BVar1 == BVar3) goto LAB_007fd2a0;
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,And);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,Or);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
        }
      }
    }
    pEVar4 = outer->left;
    if ((pEVar4->_id == BinaryId) && (outer->op == pEVar4[1]._id)) {
      EffectAnalyzer::EffectAnalyzer
                (&local_1a8,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,outer->right);
      if ((((local_1a8.trap == false) &&
           (((local_1a8.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
             (local_1a8.danglingPop == false)) &&
            (local_1a8.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) &&
          ((((local_1a8.writesMemory == false && (local_1a8.writesTable == false)) &&
            (local_1a8.writesStruct == false)) &&
           ((local_1a8.writesArray == false && (local_1a8.isAtomic == false)))))) &&
         ((local_1a8.calls == false &&
          ((local_1a8.throws_ == false &&
           (local_1a8.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))))) {
        local_31 = true;
        if (local_1a8.branchesOut == false) {
          local_31 = local_1a8.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count != 0;
        }
      }
      else {
        local_31 = true;
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.delegateTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.breakTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.globalsWritten._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.mutableGlobalsRead._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_1a8.localsWritten._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_1a8.localsRead._M_t);
      if (local_1a8.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a8.funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_31 == false) {
        bVar2 = ExpressionAnalyzer::equal(*(Expression **)(pEVar4 + 2),outer->right);
        if (bVar2) {
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,Xor);
          if (BVar1 == BVar3) {
LAB_007fd2a0:
            return (Expression *)pEVar4[1].type.id;
          }
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,RemS);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,RemU);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,And);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,Or);
          if (BVar1 == BVar3) {
            return pEVar4;
          }
        }
        bVar2 = ExpressionAnalyzer::equal((Expression *)pEVar4[1].type.id,outer->right);
        if ((bVar2) &&
           (bVar2 = EffectAnalyzer::canReorder
                              (&((this->
                                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                 ).super_Pass.runner)->options,
                               (this->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).
                               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .
                               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .currModule,(Expression *)pEVar4[1].type.id,
                               *(Expression **)(pEVar4 + 2)), bVar2)) {
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,Xor);
          if (BVar1 != BVar3) {
            BVar1 = outer->op;
            BVar3 = Abstract::getBinary(type,And);
            if (BVar1 == BVar3) {
              return pEVar4;
            }
            BVar1 = outer->op;
            BVar3 = Abstract::getBinary(type,Or);
            if (BVar1 == BVar3) {
              return pEVar4;
            }
            return (Expression *)0x0;
          }
LAB_007fd34e:
          return *(Expression **)(pEVar4 + 2);
        }
      }
    }
  }
  return (Expression *)0x0;
}

Assistant:

Expression* deduplicateBinary(Binary* outer) {
    Type type = outer->type;
    if (type.isInteger()) {
      if (auto* inner = outer->right->dynCast<Binary>()) {
        if (outer->op == inner->op) {
          if (!EffectAnalyzer(getPassOptions(), *getModule(), outer->left)
                 .hasSideEffects()) {
            if (ExpressionAnalyzer::equal(inner->left, outer->left)) {
              // x - (x - y)  ==>   y
              // x ^ (x ^ y)  ==>   y
              if (outer->op == Abstract::getBinary(type, Abstract::Sub) ||
                  outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->right;
              }
              // x & (x & y)  ==>   x & y
              // x | (x | y)  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
            if (ExpressionAnalyzer::equal(inner->right, outer->left) &&
                canReorder(outer->left, inner->left)) {
              // x ^ (y ^ x)  ==>   y
              // (note that we need the check for reordering here because if
              // e.g. y writes to a local that x reads, the second appearance
              // of x would be different from the first)
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->left;
              }

              // x & (y & x)  ==>   y & x
              // x | (y | x)  ==>   y | x
              // (here we need the check for reordering for the more obvious
              // reason that previously x appeared before y, and now y appears
              // first; or, if we tried to emit x [&|] y here, reversing the
              // order, we'd be in the same situation as the previous comment)
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
          }
        }
      }
      if (auto* inner = outer->left->dynCast<Binary>()) {
        if (outer->op == inner->op) {
          if (!EffectAnalyzer(getPassOptions(), *getModule(), outer->right)
                 .hasSideEffects()) {
            if (ExpressionAnalyzer::equal(inner->right, outer->right)) {
              // (x ^ y) ^ y  ==>   x
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->left;
              }
              // (x % y) % y  ==>   x % y
              // (x & y) & y  ==>   x & y
              // (x | y) | y  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::RemS) ||
                  outer->op == Abstract::getBinary(type, Abstract::RemU) ||
                  outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
            // See comments in the parallel code earlier about ordering here.
            if (ExpressionAnalyzer::equal(inner->left, outer->right) &&
                canReorder(inner->left, inner->right)) {
              // (x ^ y) ^ x  ==>   y
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->right;
              }
              // (x & y) & x  ==>   x & y
              // (x | y) | x  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
          }
        }
      }
    }
    return nullptr;
  }